

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_block.cpp
# Opt level: O1

uint32_t __thiscall cppnet::BufferBlock::GetCanReadLength(BufferBlock *this)

{
  char *pcVar1;
  char *pcVar2;
  
  pcVar2 = this->_read;
  pcVar1 = this->_write;
  if (pcVar1 <= pcVar2) {
    if (pcVar2 <= pcVar1) {
      if (this->_can_read != true) {
        return 0;
      }
      return this->_total_size;
    }
    pcVar1 = (char *)(ulong)(uint)((int)pcVar1 + *(int *)&this->_buffer_end);
    pcVar2 = (char *)(ulong)(uint)((int)pcVar2 + *(int *)&this->_buffer_start);
  }
  return (int)pcVar1 - (int)pcVar2;
}

Assistant:

uint32_t BufferBlock::GetCanReadLength() {
    if (_write > _read) {
        return (uint32_t)(_write - _read);

    } else if (_write < _read) {
        return (uint32_t)((_buffer_end - _read) + (_write - _buffer_start));

    } else {
        if (_can_read) {
            return _total_size;

        } else {
            return 0;
        }
    }
}